

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void Catch::anon_unknown_1::printTotals(ostream *out,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  ostream *poVar4;
  long in_RSI;
  ostream *in_RDI;
  Colour colour_2;
  Colour colour_1;
  string qualify_assertions_failed;
  Colour colour;
  undefined4 in_stack_fffffffffffffc08;
  Code in_stack_fffffffffffffc0c;
  pluralise *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc38;
  allocator local_2d1;
  string local_2d0 [79];
  allocator local_281;
  string local_280 [72];
  string local_238 [39];
  allocator local_211;
  string local_210 [79];
  allocator local_1c1;
  string local_1c0 [79];
  allocator local_171;
  string local_170 [72];
  string local_128 [39];
  allocator local_101;
  string local_100 [79];
  allocator local_b1;
  string local_b0 [72];
  string local_68 [48];
  string local_38 [40];
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = Counts::total((Counts *)(in_RSI + 0x20));
  if (sVar1 == 0) {
    std::operator<<(local_8,"No tests ran.");
  }
  else {
    sVar1 = *(size_t *)(local_10 + 0x28);
    sVar2 = Counts::total((Counts *)(local_10 + 0x20));
    if (sVar1 == sVar2) {
      Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
      sVar1 = *(size_t *)(local_10 + 0x10);
      sVar2 = Counts::total((Counts *)(local_10 + 8));
      if (sVar1 == sVar2) {
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
      }
      else {
        std::__cxx11::string::string(local_38);
      }
      poVar3 = std::operator<<(local_8,"Failed ");
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
      std::operator<<(poVar3,local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"test case",&local_b1);
      pluralise::pluralise
                (in_stack_fffffffffffffc10,
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x136e2d);
      poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      poVar3 = std::operator<<((ostream *)poVar4,", failed ");
      std::operator<<(poVar3,local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"assertion",&local_101);
      pluralise::pluralise
                (in_stack_fffffffffffffc10,
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x136eef);
      poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      std::operator<<((ostream *)poVar4,'.');
      pluralise::~pluralise((pluralise *)0x136f31);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      pluralise::~pluralise((pluralise *)0x136f58);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
      Colour::~Colour((Colour *)0x136f99);
    }
    else {
      sVar1 = Counts::total((Counts *)(local_10 + 8));
      if (sVar1 == 0) {
        poVar3 = std::operator<<(local_8,"Passed ");
        Counts::total((Counts *)(local_10 + 0x20));
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
        std::operator<<(poVar3,local_128);
        Counts::total((Counts *)(local_10 + 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"test case",&local_171);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x1371d3)
        ;
        poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<((ostream *)poVar4," (no assertions).");
        pluralise::~pluralise((pluralise *)0x137217);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string(local_128);
      }
      else if (*(long *)(local_10 + 0x10) == 0) {
        Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
        poVar3 = std::operator<<(local_8,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38);
        std::operator<<(poVar3,local_238);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_280,"test case",&local_281);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x137647)
        ;
        poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<((ostream *)poVar4," with ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"assertion",&local_2d1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x1376d2)
        ;
        poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<((ostream *)poVar4,'.');
        pluralise::~pluralise((pluralise *)0x13770b);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        pluralise::~pluralise((pluralise *)0x137732);
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        std::__cxx11::string::~string(local_238);
        Colour::~Colour((Colour *)0x137766);
      }
      else {
        Colour::Colour((Colour *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
        std::operator<<(local_8,"Failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"test case",&local_1c1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x137373)
        ;
        poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<((ostream *)poVar4,", failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"assertion",&local_211);
        pluralise::pluralise
                  (in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),(string *)0x137401)
        ;
        poVar4 = Catch::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::operator<<((ostream *)poVar4,'.');
        pluralise::~pluralise((pluralise *)0x13743a);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        pluralise::~pluralise((pluralise *)0x137461);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        Colour::~Colour((Colour *)0x137488);
      }
    }
  }
  return;
}

Assistant:

void printTotals(std::ostream& out, const Totals& totals) {
    if (totals.testCases.total() == 0) {
        out << "No tests ran.";
    } else if (totals.testCases.failed == totals.testCases.total()) {
        Colour colour(Colour::ResultError);
        const std::string qualify_assertions_failed =
            totals.assertions.failed == totals.assertions.total() ?
            bothOrAll(totals.assertions.failed) : std::string();
        out <<
            "Failed " << bothOrAll(totals.testCases.failed)
            << pluralise(totals.testCases.failed, "test case") << ", "
            "failed " << qualify_assertions_failed <<
            pluralise(totals.assertions.failed, "assertion") << '.';
    } else if (totals.assertions.total() == 0) {
        out <<
            "Passed " << bothOrAll(totals.testCases.total())
            << pluralise(totals.testCases.total(), "test case")
            << " (no assertions).";
    } else if (totals.assertions.failed) {
        Colour colour(Colour::ResultError);
        out <<
            "Failed " << pluralise(totals.testCases.failed, "test case") << ", "
            "failed " << pluralise(totals.assertions.failed, "assertion") << '.';
    } else {
        Colour colour(Colour::ResultSuccess);
        out <<
            "Passed " << bothOrAll(totals.testCases.passed)
            << pluralise(totals.testCases.passed, "test case") <<
            " with " << pluralise(totals.assertions.passed, "assertion") << '.';
    }
}